

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

void __thiscall
duckdb::Binder::AddUsingBindingSet
          (Binder *this,
          unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true> *set
          )

{
  Binder *pBVar1;
  _Head_base<0UL,_duckdb::UsingColumnSet_*,_false> local_10;
  
  pBVar1 = GetRootBinder(this);
  local_10._M_head_impl =
       (set->super_unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>)
       ._M_t.
       super___uniq_ptr_impl<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::UsingColumnSet_*,_std::default_delete<duckdb::UsingColumnSet>_>
       .super__Head_base<0UL,_duckdb::UsingColumnSet_*,_false>._M_head_impl;
  (set->super_unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>)._M_t
  .super___uniq_ptr_impl<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::UsingColumnSet_*,_std::default_delete<duckdb::UsingColumnSet>_>.
  super__Head_base<0UL,_duckdb::UsingColumnSet_*,_false>._M_head_impl = (UsingColumnSet *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::UsingColumnSet,std::default_delete<duckdb::UsingColumnSet>,true>,std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,std::default_delete<duckdb::UsingColumnSet>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::UsingColumnSet,std::default_delete<duckdb::UsingColumnSet>,true>>
            ((vector<duckdb::unique_ptr<duckdb::UsingColumnSet,std::default_delete<duckdb::UsingColumnSet>,true>,std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,std::default_delete<duckdb::UsingColumnSet>,true>>>
              *)&(pBVar1->bind_context).using_column_sets,
             (unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
              *)&local_10);
  ::std::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>::
  ~unique_ptr((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_> *)
              &local_10);
  return;
}

Assistant:

void Binder::AddUsingBindingSet(unique_ptr<UsingColumnSet> set) {
	auto &root_binder = GetRootBinder();
	root_binder.bind_context.AddUsingBindingSet(std::move(set));
}